

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExternInterfaceMethodSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternInterfaceMethodSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,FunctionPrototypeSyntax *args_3,Token *args_4)

{
  Token externKeyword;
  Token forkJoin;
  Token semi;
  ExternInterfaceMethodSyntax *this_00;
  Token *args_local_4;
  FunctionPrototypeSyntax *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ExternInterfaceMethodSyntax *)allocate(this,0x78,8);
  externKeyword.kind = args_1->kind;
  externKeyword._2_1_ = args_1->field_0x2;
  externKeyword.numFlags.raw = (args_1->numFlags).raw;
  externKeyword.rawLen = args_1->rawLen;
  externKeyword.info = args_1->info;
  forkJoin.kind = args_2->kind;
  forkJoin._2_1_ = args_2->field_0x2;
  forkJoin.numFlags.raw = (args_2->numFlags).raw;
  forkJoin.rawLen = args_2->rawLen;
  forkJoin.info = args_2->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::ExternInterfaceMethodSyntax::ExternInterfaceMethodSyntax
            (this_00,args,externKeyword,forkJoin,args_3,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }